

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFEFStreamObjectHelper * __thiscall
QPDFEFStreamObjectHelper::setSubtype(QPDFEFStreamObjectHelper *this,string *subtype)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  QPDFObjectHandle local_80;
  allocator<char> local_69;
  string local_68;
  QPDFObjectHelper local_38;
  string *subtype_local;
  QPDFEFStreamObjectHelper *this_local;
  
  local_38.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subtype;
  subtype_local = (string *)this;
  QPDFObjectHelper::oh(&local_38);
  QPDFObjectHandle::getDict
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/Subtype",&local_69);
  std::operator+(&local_a0,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_38.oh_.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  QPDFObjectHandle::newName(&local_80,&local_a0);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_68,
             &local_80);
  QPDFObjectHandle::~QPDFObjectHandle(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_38);
  return this;
}

Assistant:

QPDFEFStreamObjectHelper&
QPDFEFStreamObjectHelper::setSubtype(std::string const& subtype)
{
    oh().getDict().replaceKey("/Subtype", QPDFObjectHandle::newName("/" + subtype));
    return *this;
}